

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeCanonicalizerAndResolverTester.h
# Opt level: O0

void __thiscall
psy::C::TypeCanonicalizerAndResolverTester::TypeCanonicalizerAndResolverTester
          (TypeCanonicalizerAndResolverTester *this,TestSuite *suite)

{
  initializer_list<std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>_>
  __l;
  _Any_data *local_f68;
  allocator<std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>_>
  local_f41;
  char *local_f40;
  code *local_f38;
  undefined8 local_f30;
  char *local_f28;
  code *local_f20;
  undefined8 local_f18;
  char *local_f10;
  code *local_f08;
  undefined8 local_f00;
  char *local_ef8;
  code *local_ef0;
  undefined8 local_ee8;
  char *local_ee0;
  code *local_ed8;
  undefined8 local_ed0;
  char *local_ec8;
  code *local_ec0;
  undefined8 local_eb8;
  char *local_eb0;
  code *local_ea8;
  undefined8 local_ea0;
  char *local_e98;
  code *local_e90;
  undefined8 local_e88;
  char *local_e80;
  code *local_e78;
  undefined8 local_e70;
  char *local_e68;
  code *local_e60;
  undefined8 local_e58;
  char *local_e50;
  code *local_e48;
  undefined8 local_e40;
  char *local_e38;
  code *local_e30;
  undefined8 local_e28;
  char *local_e20;
  code *local_e18;
  undefined8 local_e10;
  char *local_e08;
  code *local_e00;
  undefined8 local_df8;
  char *local_df0;
  code *local_de8;
  undefined8 local_de0;
  char *local_dd8;
  code *local_dd0;
  undefined8 local_dc8;
  char *local_dc0;
  code *local_db8;
  undefined8 local_db0;
  char *local_da8;
  code *local_da0;
  undefined8 local_d98;
  char *local_d90;
  code *local_d88;
  undefined8 local_d80;
  char *local_d78;
  code *local_d70;
  undefined8 local_d68;
  char *local_d60;
  code *local_d58;
  undefined8 local_d50;
  char *local_d48;
  code *local_d40;
  undefined8 local_d38;
  char *local_d30;
  code *local_d28;
  undefined8 local_d20;
  char *local_d18;
  code *local_d10;
  undefined8 local_d08;
  char *local_d00;
  code *local_cf8;
  undefined8 local_cf0;
  char *local_ce8;
  code *local_ce0;
  undefined8 local_cd8;
  char *local_cd0;
  code *local_cc8;
  undefined8 local_cc0;
  char *local_cb8;
  code *local_cb0;
  undefined8 local_ca8;
  char *local_ca0;
  code *local_c98;
  undefined8 local_c90;
  char *local_c88;
  code *local_c80;
  undefined8 local_c78;
  char *local_c70;
  code *local_c68;
  undefined8 local_c60;
  char *local_c58;
  code *local_c50;
  undefined8 local_c48;
  char *local_c40;
  code *local_c38;
  undefined8 local_c30;
  char *local_c28;
  code *local_c20;
  undefined8 local_c18;
  char *local_c10;
  code *local_c08;
  undefined8 local_c00;
  char *local_bf8;
  code *local_bf0;
  undefined8 local_be8;
  char *local_be0;
  code *local_bd8;
  undefined8 local_bd0;
  char *local_bc8;
  code *local_bc0;
  undefined8 local_bb8;
  char *local_bb0;
  code *local_ba8;
  undefined8 local_ba0;
  char *local_b98;
  code *local_b90;
  undefined8 local_b88;
  char *local_b80;
  code *local_b78;
  undefined8 local_b70;
  char *local_b68;
  code *local_b60;
  undefined8 local_b58;
  char *local_b50;
  code *local_b48;
  undefined8 local_b40;
  char *local_b38;
  code *local_b30;
  undefined8 local_b28;
  char *local_b20;
  code *local_b18;
  undefined8 local_b10;
  char *local_b08;
  code *local_b00;
  undefined8 local_af8;
  char *local_af0;
  code *local_ae8;
  undefined8 local_ae0;
  char *local_ad8;
  code *local_ad0;
  undefined8 local_ac8;
  char *local_ac0;
  code *local_ab8;
  undefined8 local_ab0;
  char *local_aa8;
  code *local_aa0;
  undefined8 local_a98;
  char *local_a90;
  code *local_a88;
  undefined8 local_a80;
  char *local_a78;
  code *local_a70;
  undefined8 local_a68;
  char *local_a60;
  code *local_a58;
  undefined8 local_a50;
  char *local_a48;
  code *local_a40;
  undefined8 local_a38;
  char *local_a30;
  code *local_a28;
  undefined8 local_a20;
  char *local_a18;
  code *local_a10;
  undefined8 local_a08;
  char *local_a00;
  code *local_9f8;
  undefined8 local_9f0;
  char *local_9e8;
  code *local_9e0;
  undefined8 local_9d8;
  char *local_9d0;
  code *local_9c8;
  undefined8 local_9c0;
  char *local_9a8;
  code *local_9a0;
  undefined8 local_998;
  _Any_data *local_990;
  _Any_data local_988 [2];
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_960;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_938;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_910;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_8e8;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_8c0;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_898;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_870;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_848;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_820;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_7f8;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_7d0;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_7a8;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_780;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_758;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_730;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_708;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_6e0;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_6b8;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_690;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_668;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_640;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_618;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_5f0;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_5c8;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_5a0;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_578;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_550;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_528;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_500;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_4d8;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_4b0;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_488;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_460;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_438;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_410;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_3e8;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_3c0;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_398;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_370;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_348;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_320;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_2f8;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_2d0;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_2a8;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_280;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_258;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_230;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_208;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_1e0;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_1b8;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_190;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_168;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_140;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_118;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_f0;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_c8;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_a0;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_78;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_50;
  _Any_data local_28;
  TestSuite *local_18;
  TestSuite *suite_local;
  TypeCanonicalizerAndResolverTester *this_local;
  
  local_18 = suite;
  suite_local = (TestSuite *)this;
  Tester::Tester(&this->super_Tester,suite);
  (this->super_Tester)._vptr_Tester =
       (_func_int **)&PTR__TypeCanonicalizerAndResolverTester_007364c0;
  local_990 = local_988;
  local_9a0 = case0000;
  local_998 = 0;
  local_9a8 = "case0000";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_9a0,
             &local_9a8);
  local_990 = (_Any_data *)&local_960;
  local_9c8 = case0001;
  local_9c0 = 0;
  local_9d0 = "case0001";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_9c8,
             &local_9d0);
  local_990 = (_Any_data *)&local_938;
  local_9e0 = case0002;
  local_9d8 = 0;
  local_9e8 = "case0002";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_9e0,
             &local_9e8);
  local_990 = (_Any_data *)&local_910;
  local_9f8 = case0003;
  local_9f0 = 0;
  local_a00 = "case0003";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_9f8,
             &local_a00);
  local_990 = (_Any_data *)&local_8e8;
  local_a10 = case0004;
  local_a08 = 0;
  local_a18 = "case0004";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_a10,
             &local_a18);
  local_990 = (_Any_data *)&local_8c0;
  local_a28 = case0005;
  local_a20 = 0;
  local_a30 = "case0005";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_a28,
             &local_a30);
  local_990 = (_Any_data *)&local_898;
  local_a40 = case0006;
  local_a38 = 0;
  local_a48 = "case0006";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_a40,
             &local_a48);
  local_990 = (_Any_data *)&local_870;
  local_a58 = case0007;
  local_a50 = 0;
  local_a60 = "case0007";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_a58,
             &local_a60);
  local_990 = (_Any_data *)&local_848;
  local_a70 = case0008;
  local_a68 = 0;
  local_a78 = "case0008";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_a70,
             &local_a78);
  local_990 = (_Any_data *)&local_820;
  local_a88 = case0009;
  local_a80 = 0;
  local_a90 = "case0009";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_a88,
             &local_a90);
  local_990 = (_Any_data *)&local_7f8;
  local_aa0 = case0010;
  local_a98 = 0;
  local_aa8 = "case0010";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_aa0,
             &local_aa8);
  local_990 = (_Any_data *)&local_7d0;
  local_ab8 = case0011;
  local_ab0 = 0;
  local_ac0 = "case0011";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_ab8,
             &local_ac0);
  local_990 = (_Any_data *)&local_7a8;
  local_ad0 = case0012;
  local_ac8 = 0;
  local_ad8 = "case0012";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_ad0,
             &local_ad8);
  local_990 = (_Any_data *)&local_780;
  local_ae8 = case0013;
  local_ae0 = 0;
  local_af0 = "case0013";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_ae8,
             &local_af0);
  local_990 = (_Any_data *)&local_758;
  local_b00 = case0014;
  local_af8 = 0;
  local_b08 = "case0014";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_b00,
             &local_b08);
  local_990 = (_Any_data *)&local_730;
  local_b18 = case0015;
  local_b10 = 0;
  local_b20 = "case0015";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_b18,
             &local_b20);
  local_990 = (_Any_data *)&local_708;
  local_b30 = case0016;
  local_b28 = 0;
  local_b38 = "case0016";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_b30,
             &local_b38);
  local_990 = (_Any_data *)&local_6e0;
  local_b48 = case0017;
  local_b40 = 0;
  local_b50 = "case0017";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_b48,
             &local_b50);
  local_990 = (_Any_data *)&local_6b8;
  local_b60 = case0018;
  local_b58 = 0;
  local_b68 = "case0018";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_b60,
             &local_b68);
  local_990 = (_Any_data *)&local_690;
  local_b78 = case0019;
  local_b70 = 0;
  local_b80 = "case0019";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_b78,
             &local_b80);
  local_990 = (_Any_data *)&local_668;
  local_b90 = case0020;
  local_b88 = 0;
  local_b98 = "case0020";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_b90,
             &local_b98);
  local_990 = (_Any_data *)&local_640;
  local_ba8 = case0021;
  local_ba0 = 0;
  local_bb0 = "case0021";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_ba8,
             &local_bb0);
  local_990 = (_Any_data *)&local_618;
  local_bc0 = case0022;
  local_bb8 = 0;
  local_bc8 = "case0022";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_bc0,
             &local_bc8);
  local_990 = (_Any_data *)&local_5f0;
  local_bd8 = case0023;
  local_bd0 = 0;
  local_be0 = "case0023";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_bd8,
             &local_be0);
  local_990 = (_Any_data *)&local_5c8;
  local_bf0 = case0024;
  local_be8 = 0;
  local_bf8 = "case0024";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_bf0,
             &local_bf8);
  local_990 = (_Any_data *)&local_5a0;
  local_c08 = case0025;
  local_c00 = 0;
  local_c10 = "case0025";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_c08,
             &local_c10);
  local_990 = (_Any_data *)&local_578;
  local_c20 = case0026;
  local_c18 = 0;
  local_c28 = "case0026";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_c20,
             &local_c28);
  local_990 = (_Any_data *)&local_550;
  local_c38 = case0027;
  local_c30 = 0;
  local_c40 = "case0027";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_c38,
             &local_c40);
  local_990 = (_Any_data *)&local_528;
  local_c50 = case0028;
  local_c48 = 0;
  local_c58 = "case0028";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_c50,
             &local_c58);
  local_990 = (_Any_data *)&local_500;
  local_c68 = case0029;
  local_c60 = 0;
  local_c70 = "case0029";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_c68,
             &local_c70);
  local_990 = (_Any_data *)&local_4d8;
  local_c80 = case0030;
  local_c78 = 0;
  local_c88 = "case0030";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_c80,
             &local_c88);
  local_990 = (_Any_data *)&local_4b0;
  local_c98 = case0031;
  local_c90 = 0;
  local_ca0 = "case0031";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_c98,
             &local_ca0);
  local_990 = (_Any_data *)&local_488;
  local_cb0 = case0032;
  local_ca8 = 0;
  local_cb8 = "case0032";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_cb0,
             &local_cb8);
  local_990 = (_Any_data *)&local_460;
  local_cc8 = case0033;
  local_cc0 = 0;
  local_cd0 = "case0033";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_cc8,
             &local_cd0);
  local_990 = (_Any_data *)&local_438;
  local_ce0 = case0034;
  local_cd8 = 0;
  local_ce8 = "case0034";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_ce0,
             &local_ce8);
  local_990 = (_Any_data *)&local_410;
  local_cf8 = case0035;
  local_cf0 = 0;
  local_d00 = "case0035";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_cf8,
             &local_d00);
  local_990 = (_Any_data *)&local_3e8;
  local_d10 = case0036;
  local_d08 = 0;
  local_d18 = "case0036";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_d10,
             &local_d18);
  local_990 = (_Any_data *)&local_3c0;
  local_d28 = case0037;
  local_d20 = 0;
  local_d30 = "case0037";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_d28,
             &local_d30);
  local_990 = (_Any_data *)&local_398;
  local_d40 = case0038;
  local_d38 = 0;
  local_d48 = "case0038";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_d40,
             &local_d48);
  local_990 = (_Any_data *)&local_370;
  local_d58 = case0039;
  local_d50 = 0;
  local_d60 = "case0039";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_d58,
             &local_d60);
  local_990 = (_Any_data *)&local_348;
  local_d70 = case0040;
  local_d68 = 0;
  local_d78 = "case0040";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_d70,
             &local_d78);
  local_990 = (_Any_data *)&local_320;
  local_d88 = case0041;
  local_d80 = 0;
  local_d90 = "case0041";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_d88,
             &local_d90);
  local_990 = (_Any_data *)&local_2f8;
  local_da0 = case0042;
  local_d98 = 0;
  local_da8 = "case0042";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_da0,
             &local_da8);
  local_990 = (_Any_data *)&local_2d0;
  local_db8 = case0043;
  local_db0 = 0;
  local_dc0 = "case0043";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_db8,
             &local_dc0);
  local_990 = (_Any_data *)&local_2a8;
  local_dd0 = case0044;
  local_dc8 = 0;
  local_dd8 = "case0044";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_dd0,
             &local_dd8);
  local_990 = (_Any_data *)&local_280;
  local_de8 = case0045;
  local_de0 = 0;
  local_df0 = "case0045";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_de8,
             &local_df0);
  local_990 = (_Any_data *)&local_258;
  local_e00 = case0046;
  local_df8 = 0;
  local_e08 = "case0046";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_e00,
             &local_e08);
  local_990 = (_Any_data *)&local_230;
  local_e18 = case0047;
  local_e10 = 0;
  local_e20 = "case0047";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_e18,
             &local_e20);
  local_990 = (_Any_data *)&local_208;
  local_e30 = case0048;
  local_e28 = 0;
  local_e38 = "case0048";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_e30,
             &local_e38);
  local_990 = (_Any_data *)&local_1e0;
  local_e48 = case0049;
  local_e40 = 0;
  local_e50 = "case0049";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_e48,
             &local_e50);
  local_990 = (_Any_data *)&local_1b8;
  local_e60 = case0050;
  local_e58 = 0;
  local_e68 = "case0050";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_e60,
             &local_e68);
  local_990 = (_Any_data *)&local_190;
  local_e78 = case0051;
  local_e70 = 0;
  local_e80 = "case0051";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_e78,
             &local_e80);
  local_990 = (_Any_data *)&local_168;
  local_e90 = case0052;
  local_e88 = 0;
  local_e98 = "case0052";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_e90,
             &local_e98);
  local_990 = (_Any_data *)&local_140;
  local_ea8 = case0053;
  local_ea0 = 0;
  local_eb0 = "case0053";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_ea8,
             &local_eb0);
  local_990 = (_Any_data *)&local_118;
  local_ec0 = case0054;
  local_eb8 = 0;
  local_ec8 = "case0054";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_ec0,
             &local_ec8);
  local_990 = (_Any_data *)&local_f0;
  local_ed8 = case0055;
  local_ed0 = 0;
  local_ee0 = "case0055";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_ed8,
             &local_ee0);
  local_990 = (_Any_data *)&local_c8;
  local_ef0 = case0056;
  local_ee8 = 0;
  local_ef8 = "case0056";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_ef0,
             &local_ef8);
  local_990 = (_Any_data *)&local_a0;
  local_f08 = case0057;
  local_f00 = 0;
  local_f10 = "case0057";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_f08,
             &local_f10);
  local_990 = (_Any_data *)&local_78;
  local_f20 = case0058;
  local_f18 = 0;
  local_f28 = "case0058";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_f20,
             &local_f28);
  local_990 = (_Any_data *)&local_50;
  local_f38 = case0059;
  local_f30 = 0;
  local_f40 = "case0059";
  std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
  pair<void_(psy::C::TypeCanonicalizerAndResolverTester::*)(),_true>
            ((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>
              *)local_990,(offset_in_TypeCanonicalizerAndResolverTester_to_subr *)&local_f38,
             &local_f40);
  local_28._M_unused._M_object = local_988;
  local_28._8_8_ = 0x3c;
  std::
  allocator<std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>_>
  ::allocator(&local_f41);
  __l._M_len = local_28._8_8_;
  __l._M_array = (iterator)local_28._M_unused._0_8_;
  std::
  vector<std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>,_std::allocator<std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>_>_>
  ::vector(&this->tests_,__l,&local_f41);
  std::
  allocator<std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>_>
  ::~allocator(&local_f41);
  local_f68 = &local_28;
  do {
    local_f68 = (_Any_data *)((long)local_f68 + -0x28);
    std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>::
    ~pair((pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> *)
          local_f68);
  } while (local_f68 != local_988);
  return;
}

Assistant:

TypeCanonicalizerAndResolverTester(TestSuite* suite)
        : Tester(suite)
    {}